

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O0

state_status_t
tchecker::zg::final(system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,zone_sptr_t *zone,
                   vedge_sptr_t *vedge,sync_id_t *sync_id,clock_constraint_container_t *invariant,
                   semantics_t *semantics,extrapolation_t *extrapolation,final_value_t *final_range)

{
  bool bVar1;
  zone_t *pzVar2;
  db_t *pdVar3;
  size_t sVar4;
  vloc_t *vloc_00;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar5;
  bool delay_allowed;
  clock_id_t dim;
  db_t *dbm;
  state_status_t status;
  sync_id_t *sync_id_local;
  vedge_sptr_t *vedge_local;
  zone_sptr_t *zone_local;
  intval_sptr_t *intval_local;
  vloc_sptr_t *vloc_local;
  system_t *system_local;
  
  system_local._4_4_ = ta::final(system,vloc,intval,vedge,sync_id,invariant,final_range);
  if (system_local._4_4_ == 1) {
    pzVar2 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
              ::operator->(zone)->super_zone_t;
    pdVar3 = zone_t::dbm(pzVar2);
    pzVar2 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
              ::operator->(zone)->super_zone_t;
    sVar4 = zone_t::dim(pzVar2);
    vloc_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
               ::operator*(vloc)->super_vloc_t;
    bVar1 = ta::delay_allowed(system,vloc_00);
    system_local._4_4_ =
         (*semantics->_vptr_semantics_t[3])
                   (semantics,pdVar3,sVar4 & 0xffffffff,(ulong)bVar1,invariant);
    if (system_local._4_4_ == 1) {
      pmVar5 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
               ::operator*(vloc);
      (*extrapolation->_vptr_extrapolation_t[2])(extrapolation,pdVar3,sVar4 & 0xffffffff,pmVar5);
      system_local._4_4_ = 1;
    }
  }
  return system_local._4_4_;
}

Assistant:

tchecker::state_status_t final(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                               tchecker::intval_sptr_t const & intval, tchecker::zg::zone_sptr_t const & zone,
                               tchecker::vedge_sptr_t const & vedge, tchecker::sync_id_t & sync_id,
                               tchecker::clock_constraint_container_t & invariant, tchecker::zg::semantics_t & semantics,
                               tchecker::zg::extrapolation_t & extrapolation, tchecker::zg::final_value_t const & final_range)
{
  tchecker::state_status_t status = tchecker::ta::final(system, vloc, intval, vedge, sync_id, invariant, final_range);
  if (status != tchecker::STATE_OK)
    return status;

  tchecker::dbm::db_t * dbm = zone->dbm();
  tchecker::clock_id_t dim = zone->dim();
  bool delay_allowed = tchecker::ta::delay_allowed(system, *vloc);

  status = semantics.final(dbm, dim, delay_allowed, invariant);
  if (status != tchecker::STATE_OK)
    return status;

  extrapolation.extrapolate(dbm, dim, *vloc);

  return tchecker::STATE_OK;
}